

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderTests.cpp
# Opt level: O2

void deqp::egl::anon_unknown_4::randomizeDrawOp(Random *rnd,DrawPrimitiveOp *drawOp)

{
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *this;
  pointer pVVar1;
  int iVar2;
  deUint32 dVar3;
  DepthMode DVar4;
  StencilMode SVar5;
  int iVar6;
  pointer pVVar7;
  long lVar8;
  pointer pVVar9;
  int iVar10;
  int coordNdx;
  long lVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  Vec2 e01;
  Vec2 e02;
  Vec2 csp2;
  Vec2 csp1;
  Vec2 csp0;
  
  deRandom_getUint32(&rnd->m_rnd);
  drawOp->type = PRIMITIVETYPE_TRIANGLE;
  dVar3 = deRandom_getUint32(&rnd->m_rnd);
  drawOp->count = dVar3 % 3 + 2;
  dVar3 = deRandom_getUint32(&rnd->m_rnd);
  drawOp->blend = dVar3 % 3;
  DVar4 = deRandom_getUint32(&rnd->m_rnd);
  drawOp->depth = DVar4 & DEPTHMODE_LESS;
  SVar5 = deRandom_getUint32(&rnd->m_rnd);
  drawOp->stencil = SVar5 & STENCILMODE_LEQUAL_INC;
  dVar3 = deRandom_getUint32(&rnd->m_rnd);
  drawOp->stencilRef = dVar3 % 9;
  if (drawOp->type == PRIMITIVETYPE_TRIANGLE) {
    this = &drawOp->positions;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
              (this,(long)(drawOp->count * 3));
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
              (&drawOp->colors,(long)(drawOp->count * 3));
    iVar10 = 0;
    for (lVar8 = 0; lVar8 < drawOp->count; lVar8 = lVar8 + 1) {
      fVar12 = deRandom_getFloat(&rnd->m_rnd);
      fVar15 = fVar12 + fVar12 + -1.0;
      fVar12 = deRandom_getFloat(&rnd->m_rnd);
      fVar12 = fVar12 + fVar12 + -1.0;
      iVar2 = (int)lVar8 * 3;
      for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
        iVar6 = (int)lVar11 + iVar10;
        pVVar1 = (this->
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        pVVar7 = (drawOp->colors).
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        fVar13 = deRandom_getFloat(&rnd->m_rnd);
        pVVar1[iVar6].m_data[0] = fVar13 + fVar13 + -1.0 + fVar15;
        fVar13 = deRandom_getFloat(&rnd->m_rnd);
        pVVar1[iVar6].m_data[1] = fVar13 + fVar13 + -1.0 + fVar12;
        fVar13 = deRandom_getFloat(&rnd->m_rnd);
        pVVar1[iVar6].m_data[2] = fVar13 + fVar13 + -1.0;
        pVVar1[iVar6].m_data[3] = 1.0;
        fVar13 = deRandom_getFloat(&rnd->m_rnd);
        pVVar7[iVar6].m_data[0] = fVar13 * 0.7 + 0.2;
        fVar13 = deRandom_getFloat(&rnd->m_rnd);
        pVVar7[iVar6].m_data[1] = fVar13 * 0.7 + 0.2;
        fVar13 = deRandom_getFloat(&rnd->m_rnd);
        pVVar7[iVar6].m_data[2] = fVar13 * 0.7 + 0.2;
        fVar13 = deRandom_getFloat(&rnd->m_rnd);
        pVVar7[iVar6].m_data[3] = fVar13 * 0.7 + 0.3;
      }
      pVVar1 = (this->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pVVar7 = pVVar1 + (iVar2 + 1);
      pVVar9 = pVVar1 + (iVar2 + 2);
      iVar6 = 0x29;
      do {
        csp1.m_data = *(float (*) [2])pVVar1[iVar2].m_data;
        tcu::operator/(&csp1,pVVar1[iVar2].m_data[3]);
        csp2.m_data = *(float (*) [2])pVVar7->m_data;
        tcu::operator/(&csp2,pVVar7->m_data[3]);
        e01.m_data = *(float (*) [2])pVVar9->m_data;
        tcu::operator/(&e01,pVVar9->m_data[3]);
        tcu::operator-(&csp1,&csp0);
        tcu::operator-(&csp2,&csp0);
        fVar14 = e01.m_data[0] * e02.m_data[1] - e01.m_data[1] * e02.m_data[0];
        fVar13 = -fVar14;
        if (-fVar14 <= fVar14) {
          fVar13 = fVar14;
        }
        if (0.4 <= fVar13 * 0.5) break;
        fVar13 = deRandom_getFloat(&rnd->m_rnd);
        pVVar7->m_data[0] = fVar13 + fVar13 + -1.0 + fVar15;
        fVar13 = deRandom_getFloat(&rnd->m_rnd);
        pVVar7->m_data[1] = fVar13 + fVar13 + -1.0 + fVar12;
        fVar13 = deRandom_getFloat(&rnd->m_rnd);
        pVVar7->m_data[2] = fVar13 + fVar13 + -1.0;
        pVVar7->m_data[3] = 1.0;
        fVar13 = deRandom_getFloat(&rnd->m_rnd);
        pVVar9->m_data[0] = fVar13 + fVar13 + -1.0 + fVar15;
        fVar13 = deRandom_getFloat(&rnd->m_rnd);
        pVVar9->m_data[1] = fVar13 + fVar13 + -1.0 + fVar12;
        fVar13 = deRandom_getFloat(&rnd->m_rnd);
        pVVar9->m_data[2] = fVar13 + fVar13 + -1.0;
        pVVar9->m_data[3] = 1.0;
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
      iVar10 = iVar10 + 3;
    }
  }
  return;
}

Assistant:

void randomizeDrawOp (de::Random& rnd, DrawPrimitiveOp& drawOp)
{
	const int	minStencilRef	= 0;
	const int	maxStencilRef	= 8;
	const int	minPrimitives	= 2;
	const int	maxPrimitives	= 4;

	const float	maxTriOffset	= 1.0f;
	const float	minDepth		= -1.0f; // \todo [pyry] Reference doesn't support Z clipping yet
	const float	maxDepth		= 1.0f;

	const float	minRGB			= 0.2f;
	const float	maxRGB			= 0.9f;
	const float	minAlpha		= 0.3f;
	const float	maxAlpha		= 1.0f;

	drawOp.type			= (PrimitiveType)rnd.getInt(0, PRIMITIVETYPE_LAST-1);
	drawOp.count		= rnd.getInt(minPrimitives, maxPrimitives);
	drawOp.blend		= (BlendMode)rnd.getInt(0, BLENDMODE_LAST-1);
	drawOp.depth		= (DepthMode)rnd.getInt(0, DEPTHMODE_LAST-1);
	drawOp.stencil		= (StencilMode)rnd.getInt(0, STENCILMODE_LAST-1);
	drawOp.stencilRef	= rnd.getInt(minStencilRef, maxStencilRef);

	if (drawOp.type == PRIMITIVETYPE_TRIANGLE)
	{
		drawOp.positions.resize(drawOp.count*3);
		drawOp.colors.resize(drawOp.count*3);

		for (int triNdx = 0; triNdx < drawOp.count; triNdx++)
		{
			const float		cx		= rnd.getFloat(-1.0f, 1.0f);
			const float		cy		= rnd.getFloat(-1.0f, 1.0f);

			for (int coordNdx = 0; coordNdx < 3; coordNdx++)
			{
				tcu::Vec4&	position	= drawOp.positions[triNdx*3 + coordNdx];
				tcu::Vec4&	color		= drawOp.colors[triNdx*3 + coordNdx];

				position.x()	= cx + rnd.getFloat(-maxTriOffset, maxTriOffset);
				position.y()	= cy + rnd.getFloat(-maxTriOffset, maxTriOffset);
				position.z()	= rnd.getFloat(minDepth, maxDepth);
				position.w()	= 1.0f;

				color.x()		= rnd.getFloat(minRGB, maxRGB);
				color.y()		= rnd.getFloat(minRGB, maxRGB);
				color.z()		= rnd.getFloat(minRGB, maxRGB);
				color.w()		= rnd.getFloat(minAlpha, maxAlpha);
			}

			// avoid generating narrow triangles
			{
				const int	maxAttempts	= 40;
				int			numAttempts	= 0;
				tcu::Vec4&	p0			= drawOp.positions[triNdx*3 + 0];
				tcu::Vec4&	p1			= drawOp.positions[triNdx*3 + 1];
				tcu::Vec4&	p2			= drawOp.positions[triNdx*3 + 2];

				while (isANarrowScreenSpaceTriangle(p0, p1, p2))
				{
					p1.x()	= cx + rnd.getFloat(-maxTriOffset, maxTriOffset);
					p1.y()	= cy + rnd.getFloat(-maxTriOffset, maxTriOffset);
					p1.z()	= rnd.getFloat(minDepth, maxDepth);
					p1.w()	= 1.0f;

					p2.x()	= cx + rnd.getFloat(-maxTriOffset, maxTriOffset);
					p2.y()	= cy + rnd.getFloat(-maxTriOffset, maxTriOffset);
					p2.z()	= rnd.getFloat(minDepth, maxDepth);
					p2.w()	= 1.0f;

					if (++numAttempts > maxAttempts)
					{
						DE_ASSERT(false);
						break;
					}
				}
			}
		}
	}
	else
		DE_ASSERT(false);
}